

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void compileval(vector<unsigned_int> *code,int wordtype,char *word,int wordlen)

{
  uint uVar1;
  int i;
  bool macro;
  float f;
  char *p;
  uint local_24;
  
  switch(wordtype) {
  case 1:
    if (word == (char *)0x0) {
      i = 0;
    }
    else {
      i = parseint(word);
    }
    compileint(code,i);
    return;
  case 2:
    if (word == (char *)0x0) {
      f = 0.0;
    }
    else {
      f = parsefloat(word);
    }
    compilefloat(code,f);
    return;
  case 3:
    macro = true;
    break;
  case 4:
    macro = false;
    break;
  case 5:
    uVar1 = code->ulen;
    p = (char *)CONCAT44(p._4_4_,9);
    vector<unsigned_int>::add(code,(uint *)&p);
    p = (char *)CONCAT44(p._4_4_,uVar1 * 0x100 + 0x201);
    vector<unsigned_int>::add(code,(uint *)&p);
    p = word;
    compilestatements(code,&p,0,wordlen);
    local_24 = 0xc4;
    vector<unsigned_int>::add(code,&local_24);
    code->buf[(int)uVar1] = code->buf[(int)uVar1] | (~uVar1 + code->ulen) * 0x100;
  default:
    return;
  case 7:
    compileident(code,word);
    return;
  }
  compilestr(code,word,wordlen,macro);
  return;
}

Assistant:

static inline void compileval(vector<uint> &code, int wordtype, char *word, int wordlen)
{
    switch(wordtype)
    {
        case VAL_STR: compilestr(code, word, wordlen, true); break;
        case VAL_ANY: compilestr(code, word, wordlen); break;
        case VAL_FLOAT: compilefloat(code, word); break;
        case VAL_INT: compileint(code, word); break;
        case VAL_CODE:
        {
            int start = code.length();
            code.add(CODE_BLOCK);
            code.add(CODE_OFFSET|((start+2)<<8));
            const char *p = word;
            compilestatements(code, p, VAL_ANY);
            code.add(CODE_EXIT|RET_STR);
            code[start] |= uint(code.length() - (start + 1))<<8;
            break;
        }
        case VAL_IDENT: compileident(code, word); break;
        default:
            break;
    }
}